

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_track.cpp
# Opt level: O2

void __thiscall
cp::CoMTrack::setup(CoMTrack *this,double t,double single_sup_time,double double_sup_time,
                   double cog_h)

{
  double dVar1;
  
  *(double *)this = t;
  *(double *)(this + 8) = single_sup_time;
  *(double *)(this + 0x10) = double_sup_time;
  *(double *)(this + 0x20) = cog_h;
  *(double *)(this + 0x18) = single_sup_time + double_sup_time;
  dVar1 = 9.806 / cog_h;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  *(double *)(this + 0x28) = dVar1;
  return;
}

Assistant:

void CoMTrack::setup(double t, double single_sup_time,
                     double double_sup_time, double cog_h) {
  dt = t;
  sst = single_sup_time;
  dst = double_sup_time;
  cogh = cog_h;
  st = single_sup_time + double_sup_time;

  w = sqrt(9.806 / cogh);
}